

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_strategy.cpp
# Opt level: O0

vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_> *
license::hw_identifier::available_strategies(void)

{
  initializer_list<LCC_API_HW_IDENTIFICATION_STRATEGY> __l;
  initializer_list<LCC_API_HW_IDENTIFICATION_STRATEGY> __l_00;
  initializer_list<LCC_API_HW_IDENTIFICATION_STRATEGY> __l_01;
  initializer_list<LCC_API_HW_IDENTIFICATION_STRATEGY> __l_02;
  initializer_list<LCC_API_HW_IDENTIFICATION_STRATEGY> __l_03;
  bool bVar1;
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  *in_RDI;
  LCC_API_HW_IDENTIFICATION_STRATEGY local_184 [3];
  iterator local_178;
  undefined8 local_170;
  LCC_API_HW_IDENTIFICATION_STRATEGY local_168 [2];
  iterator local_160;
  undefined8 local_158;
  LCC_API_HW_IDENTIFICATION_STRATEGY local_14c;
  iterator local_148;
  undefined8 local_140;
  LCC_API_HW_IDENTIFICATION_STRATEGY local_138 [2];
  iterator local_130;
  undefined8 local_128;
  LCC_API_HW_IDENTIFICATION_STRATEGY local_11c;
  iterator local_118;
  undefined8 local_110;
  undefined1 local_105;
  LCC_API_VIRTUALIZATION_SUMMARY local_f4;
  undefined1 local_f0 [4];
  LCC_API_VIRTUALIZATION_SUMMARY virtualization;
  ExecutionEnvironment exec;
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  *strategy_to_try;
  
  os::ExecutionEnvironment::ExecutionEnvironment((ExecutionEnvironment *)local_f0);
  local_f4 = os::ExecutionEnvironment::virtualization((ExecutionEnvironment *)local_f0);
  local_105 = 0;
  std::
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>::
  vector(in_RDI);
  if (local_f4 == CONTAINER) {
    bVar1 = os::ExecutionEnvironment::is_docker((ExecutionEnvironment *)local_f0);
    if (bVar1) {
      local_11c = STRATEGY_NONE;
      local_118 = &local_11c;
      local_110 = 1;
      __l_03._M_len = 1;
      __l_03._M_array = local_118;
      std::
      vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
      ::operator=(in_RDI,__l_03);
    }
    else {
      local_138[0] = STRATEGY_ETHERNET;
      local_138[1] = 0xfffffffe;
      local_130 = local_138;
      local_128 = 2;
      __l_02._M_len = 2;
      __l_02._M_array = local_130;
      std::
      vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
      ::operator=(in_RDI,__l_02);
    }
  }
  else if (local_f4 == VM) {
    bVar1 = os::ExecutionEnvironment::is_cloud((ExecutionEnvironment *)local_f0);
    if (bVar1) {
      local_14c = STRATEGY_NONE;
      local_148 = &local_14c;
      local_140 = 1;
      __l_01._M_len = 1;
      __l_01._M_array = local_148;
      std::
      vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
      ::operator=(in_RDI,__l_01);
    }
    else {
      local_168[0] = STRATEGY_ETHERNET;
      local_168[1] = 0xfffffffe;
      local_160 = local_168;
      local_158 = 2;
      __l_00._M_len = 2;
      __l_00._M_array = local_160;
      std::
      vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
      ::operator=(in_RDI,__l_00);
    }
  }
  else {
    local_184[0] = STRATEGY_DISK;
    local_184[1] = 4;
    local_184[2] = 0xfffffffe;
    local_178 = local_184;
    local_170 = 3;
    __l._M_len = 3;
    __l._M_array = local_178;
    std::
    vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
    ::operator=(in_RDI,__l);
  }
  local_105 = 1;
  os::ExecutionEnvironment::~ExecutionEnvironment((ExecutionEnvironment *)local_f0);
  return in_RDI;
}

Assistant:

static vector<LCC_API_HW_IDENTIFICATION_STRATEGY> available_strategies() {
	const os::ExecutionEnvironment exec;
	LCC_API_VIRTUALIZATION_SUMMARY virtualization = exec.virtualization();
	vector<LCC_API_HW_IDENTIFICATION_STRATEGY> strategy_to_try;
	if (virtualization == LCC_API_VIRTUALIZATION_SUMMARY::CONTAINER) {
		if (exec.is_docker()) {
			strategy_to_try = LCC_DOCKER_STRATEGIES;
		} else {
			strategy_to_try = LCC_LXC_STRATEGIES;
		}
	} else if (virtualization == LCC_API_VIRTUALIZATION_SUMMARY::VM) {
		if (exec.is_cloud()) {
			strategy_to_try = LCC_CLOUD_STRATEGIES;
		} else {
			strategy_to_try = LCC_VM_STRATEGIES;
		}
	} else {
		strategy_to_try = LCC_BARE_TO_METAL_STRATEGIES;
	}
	return strategy_to_try;
}